

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldNames(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  FieldDef *field;
  string *this_01;
  pointer ppFVar1;
  allocator<char> local_159;
  CppGenerator *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"  static constexpr std::array<\\",(allocator<char> *)&local_150);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"const char *, fields_number> field_names = {\\",
             (allocator<char> *)&local_150);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"};",(allocator<char> *)&local_150);
    CodeWriter::operator+=(this_00,&local_f0);
    this_01 = &local_f0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"",(allocator<char> *)&local_150);
    local_158 = this;
    CodeWriter::operator+=(this_00,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    for (ppFVar1 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
      field = *ppFVar1;
      if (field->deprecated == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"FIELD_NAME",&local_159);
        Name_abi_cxx11_(&local_50,local_158,field);
        CodeWriter::SetValue(this_00,&local_150,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"    \"{{FIELD_NAME}}\"\\",(allocator<char> *)&local_150);
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (ppFVar1 + 1 !=
            (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,",",(allocator<char> *)&local_150);
          CodeWriter::operator+=(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"\n  };",(allocator<char> *)&local_150);
    CodeWriter::operator+=(this_00,&local_130);
    this_01 = &local_130;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void GenFieldNames(const StructDef &struct_def) {
    code_ += "  static constexpr std::array<\\";
    code_ += "const char *, fields_number> field_names = {\\";
    if (struct_def.fields.vec.empty()) {
      code_ += "};";
      return;
    }
    code_ += "";
    // Generate the field_names elements.
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }
      code_.SetValue("FIELD_NAME", Name(field));
      code_ += R"(    "{{FIELD_NAME}}"\)";
      if (it + 1 != struct_def.fields.vec.end()) { code_ += ","; }
    }
    code_ += "\n  };";
  }